

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O0

aspa_status aspa_array_remove(aspa_array *array,size_t index,_Bool free_providers)

{
  long lVar1;
  aspa_record *paVar2;
  long in_FS_OFFSET;
  size_t SIZE_DECREASE_OFFSET;
  size_t trailing;
  _Bool free_providers_local;
  size_t index_local;
  aspa_array *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((array == (aspa_array *)0x0) || (array->size <= index)) || (array->size == 0)) {
    array_local._4_4_ = ASPA_RECORD_NOT_FOUND;
  }
  else {
    if ((free_providers) && (array->data[index].provider_asns != (uint32_t *)0x0)) {
      lrtr_free(array->data[index].provider_asns);
    }
    if (index < array->size - 1) {
      memmove(array->data + index,array->data + index + 1,((array->size - index) + -1) * 0x18);
    }
    array->size = array->size - 1;
    if ((ulong)array->size + 1000 < array->capacity) {
      paVar2 = (aspa_record *)lrtr_realloc(array->data,(ulong)array->size + 1000);
      array->data = paVar2;
      array->capacity = (ulong)array->size + 1000;
    }
    array_local._4_4_ = ASPA_SUCCESS;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return array_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_array_remove(struct aspa_array *array, size_t index, bool free_providers)
{
	if (!array || index >= array->size || array->size == 0)
		return ASPA_RECORD_NOT_FOUND;

	if (free_providers && array->data[index].provider_asns)
		lrtr_free(array->data[index].provider_asns);

	// No need to move if last element
	if (index < array->size - 1) {
		size_t trailing = (array->size - index - 1) * sizeof(struct aspa_record);

		/*                     trailing
		 *				   /-------------\
		 *   #3 #8 #11  *  #24 #30 #36 #37
		 *   #3 #8 #11 #24 #30 #36 #37
		 *			    ^   ^
		 *		    index   index + 1
		 */
		memmove(&array->data[index], &array->data[index + 1], trailing);
	}

	array->size -= 1;

	// decreasing capacity if possible
	const size_t SIZE_DECREASE_OFFSET = 1000;
	if (array->size + SIZE_DECREASE_OFFSET < array->capacity) {
		array->data = lrtr_realloc(array->data, array->size + SIZE_DECREASE_OFFSET);
		array->capacity = array->size + SIZE_DECREASE_OFFSET;
	}

	return ASPA_SUCCESS;
}